

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer,
              BackwardReferenceFromDecoder *backward_references,size_t back_refs_size,
              BlockSplitFromDecoder *literals_block_splits_decoder,
              BlockSplitFromDecoder *cmds_block_splits_decoder)

{
  size_t *__s;
  int *__s_00;
  uint8_t prev_byte2;
  uint8_t prev_byte;
  Command_conflict *p;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  ContextType literal_context_mode;
  size_t i_4;
  ulong uVar4;
  BrotliEncoderState *s;
  ulong uVar5;
  HasherCommon **ppHVar6;
  ulong uVar7;
  ZopfliNode *array;
  ulong uVar8;
  Command_conflict *pCVar9;
  uint8_t *puVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  undefined8 uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong num_bytes;
  ulong uVar34;
  bool bVar35;
  ulong local_7d8;
  Command_conflict *local_7d0;
  ulong local_7c8;
  size_t local_7c0;
  ulong local_7b8;
  ulong local_7b0;
  MemoryManager memory_manager;
  ulong local_780;
  ulong local_778;
  size_t num_literals;
  ulong local_760;
  ulong local_758;
  HasherCommon *local_750;
  int dist_cache [4];
  uint8_t *local_728;
  size_t local_708;
  size_t last_insert_len;
  BrotliEncoderParams params;
  int saved_dist_cache [4];
  size_t current_block_cmds;
  size_t current_block_literals;
  uint8_t *next_in;
  BlockSplit local_5b8;
  BlockSplit local_588;
  uint32_t *local_558;
  size_t sStack_550;
  uint32_t *local_548;
  size_t sStack_540;
  HistogramLiteral *local_538;
  size_t sStack_530;
  HistogramCommand *local_528;
  size_t sStack_520;
  HistogramDistance *local_518;
  size_t sStack_510;
  size_t available_in;
  uint32_t *puStack_500;
  BrotliEncoderParams *pBStack_4f8;
  BrotliHasherParams local_4f0;
  int local_4dc;
  undefined1 local_4d8 [40];
  int local_4b0;
  undefined4 uStack_4ac;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  int local_480 [8];
  undefined4 uStack_460;
  undefined4 uStack_45c;
  undefined8 local_458;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined4 local_428;
  undefined8 local_420;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  uint8_t *next_out;
  uint32_t local_74;
  
  local_7c0 = *encoded_size;
  if (input_size == 0) {
    uVar16 = 2;
  }
  else {
    uVar4 = input_size + (input_size >> 0xe) * 4 + 6;
    uVar16 = 0;
    if (input_size <= uVar4) {
      uVar16 = uVar4;
    }
  }
  if (local_7c0 == 0) {
    return 0;
  }
  if (input_size == 0) {
    *encoded_size = 1;
    *encoded_buffer = '\x06';
    goto LAB_001065b9;
  }
  if (quality != 10) {
    s = BrotliEncoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    s->backward_references_ = backward_references;
    s->back_refs_size_ = back_refs_size;
    s->literals_block_splits_decoder_ = literals_block_splits_decoder;
    s->cmds_block_splits_decoder_ = cmds_block_splits_decoder;
    if (s == (BrotliEncoderState *)0x0) {
      return 0;
    }
    params.mode = (BrotliEncoderMode)*encoded_size;
    params.quality = (int)(*encoded_size >> 0x20);
    next_out = encoded_buffer;
    memory_manager.alloc_func = (brotli_alloc_func)0x0;
    iVar3 = s->is_initialized_;
    if (iVar3 == 0) {
      (s->params).quality = quality;
      (s->params).lgwin = lgwin;
      (s->params).mode = mode;
      (s->params).size_hint = input_size & 0xffffffff;
    }
    if (0x18 < lgwin && iVar3 == 0) {
      (s->params).large_window = 1;
    }
    next_in = input_buffer;
    available_in = input_size;
    iVar3 = BrotliEncoderCompressStream
                      (s,BROTLI_OPERATION_FINISH,&available_in,&next_in,(size_t *)&params,&next_out,
                       (size_t *)&memory_manager);
    if (s->stream_state_ == BROTLI_STREAM_FINISHED) {
      sVar22 = s->available_out_;
      *encoded_size = (size_t)memory_manager.alloc_func;
      BrotliEncoderDestroyInstance(s);
      if (((iVar3 != 0) && (sVar22 == 0)) && ((uVar16 == 0 || (*encoded_size <= uVar16))))
      goto LAB_001065b9;
    }
    else {
      *encoded_size = (size_t)memory_manager.alloc_func;
      BrotliEncoderDestroyInstance(s);
    }
    goto LAB_001064c3;
  }
  uVar13 = 0x10;
  if (0x10 < lgwin) {
    uVar13 = lgwin;
  }
  uVar4 = 0x1e;
  if ((int)uVar13 < 0x1e) {
    uVar4 = (ulong)uVar13;
  }
  dist_cache[0] = 4;
  dist_cache[1] = 0xb;
  dist_cache[2] = 0xf;
  dist_cache[3] = 0x10;
  saved_dist_cache[0] = 4;
  saved_dist_cache[1] = 0xb;
  saved_dist_cache[2] = 0xf;
  saved_dist_cache[3] = 0x10;
  current_block_literals = 0;
  current_block_cmds = 0;
  uVar15 = (uint)uVar4;
  uVar20 = 1L << ((byte)uVar4 & 0x3f);
  if (input_size < uVar20) {
    uVar20 = input_size;
  }
  cVar11 = '\x17';
  if ((int)uVar13 < 0x17) {
    cVar11 = (char)uVar13;
  }
  uVar21 = 1L << (cVar11 + 1U & 0x3f);
  available_in = 0;
  params.mode = BROTLI_MODE_GENERIC;
  params.large_window = 0;
  params.quality = 0xb;
  params.lgwin = 0x16;
  params._12_8_ = 0;
  params.stream_offset._4_4_ = 0;
  params.size_hint._0_4_ = 0;
  params.size_hint._4_4_ = 0;
  params.disable_literal_context_modeling = 0;
  BrotliInitEncoderDictionary(&params.dictionary);
  params.dist.distance_postfix_bits = 0;
  params.dist.num_direct_distance_codes = 0;
  params.dist.alphabet_size_max = 0x40;
  params.dist.alphabet_size_limit = 0x40;
  params.dist.max_distance = 0x3fffffc;
  if (0x18 < lgwin) {
    params.large_window = 1;
  }
  params.quality = 10;
  uVar13 = 0x1e;
  if (params.large_window == 0) {
    uVar13 = 0x18;
  }
  params.lgwin = uVar15;
  if (uVar13 < uVar15) {
    params.lgwin = uVar13;
  }
  if (params.lgblock == 0) {
    iVar3 = 0x10;
    if ((0x10 < params.lgwin) && (iVar3 = 0x12, params.lgwin < 0x12)) {
      iVar3 = params.lgwin;
    }
  }
  else {
    iVar12 = 0x10;
    if (0x10 < params.lgblock) {
      iVar12 = params.lgblock;
    }
    iVar3 = 0x18;
    if (iVar12 < 0x18) {
      iVar3 = iVar12;
    }
  }
  params.lgblock = iVar3;
  ChooseDistanceParams(&params);
  uVar5 = 1L << ((byte)params.lgblock & 0x3f);
  BrotliInitMemoryManager(&memory_manager,(brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
  if (params.large_window == 0) {
    if (uVar15 == 0x10) {
      uVar4 = 0;
      uVar33 = 1;
    }
    else if (uVar15 == 0x11) {
      uVar33 = 7;
      uVar4 = CONCAT62((int6)(uVar4 >> 0x10),1);
    }
    else if (lgwin < 0x12) {
      uVar4 = (ulong)(uVar15 * 0x10 - 0x7f);
      uVar33 = 7;
    }
    else {
      uVar4 = (ulong)(uVar15 * 2 - 0x21);
      uVar33 = 4;
    }
  }
  else {
    uVar4 = (ulong)(uVar15 << 8 | 0x11);
    uVar33 = 0xe;
  }
  if (available_in == 0) {
    if (params.quality < 10) {
      if (CONCAT44(params.size_hint._4_4_,(undefined4)params.size_hint) < 0x100000 ||
          params.quality != 4) {
        if (params.quality < 5) {
          params.hasher.type = params.quality;
        }
        else if (params.lgwin < 0x11) {
          params.hasher.type = 0x28;
          if (6 < params.quality) {
            params.hasher.type = (params.quality == 9) + 0x29;
          }
        }
        else {
          params.hasher.block_bits = params.quality + -1;
          if (params.lgwin < 0x13 ||
              CONCAT44(params.size_hint._4_4_,(undefined4)params.size_hint) < 0x100000) {
            iVar3 = 10;
            if (params.quality == 9) {
              iVar3 = 0x10;
            }
            params.hasher.num_last_distances_to_check = 4;
            if (6 < params.quality) {
              params.hasher.num_last_distances_to_check = iVar3;
            }
            params.hasher._0_8_ = (ulong)CONCAT14(params.quality < 7,5) ^ 0xf00000000;
          }
          else {
            params.hasher.type = 6;
            params.hasher.bucket_bits = 0xf;
            params.hasher.hash_len = 5;
            iVar3 = 10;
            if (params.quality == 9) {
              iVar3 = 0x10;
            }
            params.hasher.num_last_distances_to_check = 4;
            if (6 < params.quality) {
              params.hasher.num_last_distances_to_check = iVar3;
            }
          }
        }
      }
      else {
        params.hasher.type = 0x36;
      }
    }
    else {
      params.hasher.type = 10;
    }
    if (0x18 < params.lgwin) {
      if (params.hasher.type == 3) {
        params.hasher.type = 0x23;
      }
      if (params.hasher.type == 0x36) {
        params.hasher.type = 0x37;
      }
      if (params.hasher.type == 6) {
        params.hasher.type = 0x41;
      }
    }
    sVar22 = 0;
    if (params.hasher.type < 0x23) {
      switch(params.hasher.type) {
      case 2:
      case 3:
        sVar22 = 0x40000;
        break;
      case 4:
switchD_0010502c_caseD_28:
        sVar22 = 0x80000;
        break;
      case 5:
      case 6:
        sVar22 = ((4L << ((byte)params.hasher.bucket_bits & 0x3f)) <<
                 ((byte)params.hasher.block_bits & 0x3f)) +
                 (2L << ((byte)params.hasher.bucket_bits & 0x3f));
        break;
      case 10:
        uVar7 = 1L << ((byte)params.lgwin & 0x3f);
        if (uVar20 <= uVar7) {
          uVar7 = uVar20;
        }
        sVar22 = uVar7 * 8 + 0x80000;
      }
    }
    else {
      sVar22 = 0;
      if (params.hasher.type < 0x36) {
        switch(params.hasher.type) {
        case 0x23:
          sVar22 = 0x4040000;
          break;
        case 0x28:
        case 0x29:
          goto switchD_0010502c_caseD_28;
        case 0x2a:
          sVar22 = 0x140000;
        }
      }
      else if (params.hasher.type == 0x36) {
        sVar22 = 0x400000;
      }
      else if (params.hasher.type == 0x37) {
        sVar22 = 0x4400000;
      }
      else if (params.hasher.type == 0x41) {
        sVar22 = ((4L << ((byte)params.hasher.bucket_bits & 0x3f)) <<
                 ((byte)params.hasher.block_bits & 0x3f)) +
                 (2L << ((byte)params.hasher.bucket_bits & 0x3f)) + 0x4000000;
      }
    }
    if (sVar22 == 0) {
      available_in = 0;
    }
    else {
      available_in = (size_t)BrotliAllocate(&memory_manager,sVar22);
    }
    sVar22 = CONCAT44(params.hasher.hash_len,params.hasher.block_bits);
    local_4f0.type = params.hasher.type;
    local_4f0.bucket_bits = params.hasher.bucket_bits;
    uVar1 = local_4f0._0_8_;
    local_4f0.num_last_distances_to_check = params.hasher.num_last_distances_to_check;
    local_4f0.type = params.hasher.type;
    if (local_4f0.type < 0x23) {
      local_4f0.bucket_bits = params.hasher.bucket_bits;
      switch(local_4f0.type) {
      case 2:
      case 3:
      case 4:
switchD_001051b6_caseD_2:
        local_4d8._0_8_ = &available_in;
        local_4d8._8_8_ = available_in;
        break;
      case 5:
        local_4d8._32_8_ = &available_in;
        local_4d8._0_8_ = 1L << ((byte)params.hasher.bucket_bits & 0x3f);
        local_4d8._8_8_ = 1L << ((byte)params.hasher.block_bits & 0x3f);
        local_4d8._20_4_ = (int)local_4d8._8_8_ + -1;
        local_4d8._16_4_ = 0x20 - local_4f0.bucket_bits;
        local_4a8 = (long)&((HasherCommon *)available_in)->extra + local_4d8._0_8_ * 2;
        local_4d8._24_8_ =
             CONCAT44(params.hasher.num_last_distances_to_check,params.hasher.block_bits);
        _local_4b0 = available_in;
        break;
      case 6:
        local_4a8 = &available_in;
        local_4d8._16_4_ = 0x40 - local_4f0.bucket_bits;
        local_4f0.hash_len._0_1_ = (char)params.hasher.hash_len;
        local_4d8._24_8_ = 0xffffffffffffffff >> ((char)local_4f0.hash_len * -8 & 0x3fU);
        local_4d8._0_8_ = 1L << ((byte)params.hasher.bucket_bits & 0x3f);
        local_4d8._8_8_ = 1L << ((byte)params.hasher.block_bits & 0x3f);
        local_4d8._32_8_ = CONCAT44(params.hasher.block_bits,(int)local_4d8._8_8_ + -1);
        local_4b0 = params.hasher.num_last_distances_to_check;
        uStack_498 = (long)&((HasherCommon *)available_in)->extra + local_4d8._0_8_ * 2;
        local_4a0 = available_in;
        break;
      case 10:
        local_4d8._24_8_ = &(((HasherCommon *)(available_in + 0x7ffe0))->params).block_bits;
        uVar13 = -1 << ((byte)params.lgwin & 0x1f);
        local_4d8._0_8_ = ZEXT48(~uVar13);
        local_4d8._16_4_ = uVar13 + 1;
        local_4d8._8_8_ = available_in;
      }
    }
    else if (local_4f0.type < 0x36) {
      switch(local_4f0.type) {
      case 0x23:
switchD_0010516a_caseD_23:
        local_480._24_8_ = &available_in;
        local_480._8_8_ = CONCAT44(local_4dc,params.hasher.num_last_distances_to_check);
        uStack_498 = puStack_500;
        local_490 = pBStack_4f8;
        uStack_488 = params.hasher._0_8_;
        uStack_460 = 1;
        local_458 = &params;
        local_4a0 = available_in;
        local_480._0_8_ = sVar22;
        local_480._16_8_ = available_in;
        break;
      case 0x28:
      case 0x29:
        local_4d8._24_8_ = &available_in;
        local_4d8._8_8_ = ZEXT48((params.quality < 7) + 7 << ((char)params.quality - 4U & 0x1f));
        local_4d8._16_8_ = available_in;
        break;
      case 0x2a:
        local_c8 = &available_in;
        local_d8 = ZEXT48((params.quality < 7) + 7 << ((char)params.quality - 4U & 0x1f));
        local_d0 = available_in;
      }
    }
    else {
      if (local_4f0.type == 0x36) goto switchD_001051b6_caseD_2;
      if (local_4f0.type == 0x37) goto switchD_0010516a_caseD_23;
      if (local_4f0.type == 0x41) {
        local_430 = &available_in;
        uStack_440 = CONCAT44(local_4dc,params.hasher.num_last_distances_to_check);
        _uStack_460 = puStack_500;
        local_458 = pBStack_4f8;
        uStack_450 = params.hasher.type;
        uStack_44c = params.hasher.bucket_bits;
        local_428 = 1;
        local_420 = &params;
        local_480._24_8_ = available_in;
        local_448 = sVar22;
        local_438 = available_in;
      }
    }
    local_4dc = 0;
    local_4f0._0_8_ = uVar1;
    local_4f0._8_8_ = sVar22;
  }
  uVar2 = local_d0;
  uVar1 = local_4d8._16_8_;
  if (local_4dc != 0) goto LAB_0010584a;
  uVar23 = local_4d8._8_8_;
  if (local_4f0.type < 0x23) {
    switch(local_4f0.type) {
    case 2:
      if (uVar20 < 0x801) {
        uVar7 = 0;
        do {
          *(uint32_t *)
           (local_4d8._8_8_ +
           ((ulong)(*(long *)(input_buffer + uVar7) * -0x42e1ca5843000000) >> 0x30) * 4) = 0;
          uVar7 = uVar7 + 1;
        } while (uVar20 != uVar7);
      }
      else {
LAB_00105565:
        sVar17 = 0x40000;
LAB_00105825:
        memset((void *)uVar23,0,sVar17);
      }
      break;
    case 3:
      if (0x800 < uVar20) goto LAB_00105565;
      uVar7 = 0;
      do {
        lVar31 = *(long *)(input_buffer + uVar7);
        iVar3 = 0;
        do {
          *(uint32_t *)
           (local_4d8._8_8_ +
           (ulong)((uint)(ushort)((ulong)(lVar31 * -0x42e1ca5843000000) >> 0x30) + iVar3 & 0xffff) *
           4) = 0;
          iVar3 = iVar3 + 8;
        } while (iVar3 == 8);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar20);
      break;
    case 4:
      if (0x1000 < uVar20) {
        sVar17 = 0x80000;
        goto LAB_00105825;
      }
      uVar7 = 0;
      do {
        lVar31 = *(long *)(input_buffer + uVar7);
        iVar3 = 0;
        do {
          *(uint32_t *)
           (local_4d8._8_8_ +
           (ulong)((uint)((ulong)(lVar31 * -0x42e1ca5843000000) >> 0x2f) + iVar3 & 0x1ffff) * 4) = 0
          ;
          iVar3 = iVar3 + 8;
        } while (iVar3 != 0x20);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar20);
      break;
    case 5:
      uVar23 = _local_4b0;
      if ((ulong)local_4d8._0_8_ >> 6 < uVar20) {
LAB_0010560b:
        sVar17 = local_4d8._0_8_ * 2;
        goto LAB_00105825;
      }
      uVar7 = 0;
      do {
        *(uint16_t *)
         (_local_4b0 +
         (ulong)((uint)(*(int *)(input_buffer + uVar7) * 0x1e35a7bd) >>
                ((byte)local_4d8._16_8_ & 0x1f)) * 2) = 0;
        uVar7 = uVar7 + 1;
      } while (uVar20 != uVar7);
      break;
    case 6:
      uVar23 = local_4a0;
      if ((ulong)local_4d8._0_8_ >> 6 < uVar20) goto LAB_0010560b;
      uVar7 = 0;
      do {
        *(uint16_t *)
         (local_4a0 +
         ((*(ulong *)(input_buffer + uVar7) & local_4d8._24_8_) * 0x1fe35a7bd3579bd3 >>
          ((byte)local_4d8._16_8_ & 0x3f) & 0xffffffff) * 2) = 0;
        uVar7 = uVar7 + 1;
      } while (uVar20 != uVar7);
      break;
    case 10:
      lVar31 = 0;
      do {
        *(undefined4 *)(local_4d8._8_8_ + lVar31 * 4) = local_4d8._16_4_;
        lVar31 = lVar31 + 1;
      } while (lVar31 != 0x20000);
    }
    goto switchD_00105401_caseD_24;
  }
  if (0x35 < local_4f0.type) {
    if (local_4f0.type == 0x36) {
      if (0x8000 < uVar20) {
        sVar17 = 0x400000;
        goto LAB_00105825;
      }
      uVar7 = 0;
      do {
        lVar31 = *(long *)(input_buffer + uVar7);
        iVar3 = 0;
        do {
          *(uint32_t *)
           (local_4d8._8_8_ +
           (ulong)((uint)((ulong)(lVar31 * 0x35a7bd1e35a7bd00) >> 0x2c) + iVar3 & 0xfffff) * 4) = 0;
          iVar3 = iVar3 + 8;
        } while (iVar3 != 0x20);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar20);
    }
    else if (local_4f0.type == 0x37) {
      PrepareH55(&((anon_union_1048_13_a959428b_for_privat *)local_4d8)->_H55,1,uVar20,input_buffer)
      ;
    }
    else if (local_4f0.type == 0x41) {
      PrepareH65(&((anon_union_1048_13_a959428b_for_privat *)local_4d8)->_H65,1,uVar20,input_buffer)
      ;
    }
    goto switchD_00105401_caseD_24;
  }
  switch(local_4f0.type) {
  case 0x23:
    PrepareH35(&((anon_union_1048_13_a959428b_for_privat *)local_4d8)->_H35,1,uVar20,input_buffer);
    break;
  case 0x28:
    if (uVar20 < 0x201) {
      uVar7 = 0;
      do {
        uVar27 = (ulong)((uint)(*(int *)(input_buffer + uVar7) * 0x1e35a7bd) >> 0x11);
        *(undefined4 *)(local_4d8._16_8_ + uVar27 * 4) = 0xcccccccc;
        *(undefined2 *)(local_4d8._16_8_ + uVar27 * 2 + 0x20000) = 0xcccc;
        uVar7 = uVar7 + 1;
      } while (uVar20 != uVar7);
    }
    else {
LAB_001056d2:
      __s = (size_t *)(local_4d8._16_8_ + 0x20000);
      memset((void *)local_4d8._16_8_,0xcc,0x20000);
      memset(__s,0,0x10000);
    }
    goto LAB_00105700;
  case 0x29:
    if (0x200 < uVar20) goto LAB_001056d2;
    uVar7 = 0;
    do {
      uVar27 = (ulong)((uint)(*(int *)(input_buffer + uVar7) * 0x1e35a7bd) >> 0x11);
      *(undefined4 *)(local_4d8._16_8_ + uVar27 * 4) = 0xcccccccc;
      *(undefined2 *)(local_4d8._16_8_ + uVar27 * 2 + 0x20000) = 0xcccc;
      uVar7 = uVar7 + 1;
    } while (uVar20 != uVar7);
LAB_00105700:
    memset((size_t *)(uVar1 + 0x30000),0,0x10000);
    local_4d8._0_8_ = local_4d8._0_8_ & 0xffffffffffff0000;
    break;
  case 0x2a:
    if (uVar20 < 0x201) {
      uVar7 = 0;
      do {
        uVar27 = (ulong)((uint)(*(int *)(input_buffer + uVar7) * 0x1e35a7bd) >> 0x11);
        *(undefined4 *)(local_d0 + uVar27 * 4) = 0xcccccccc;
        *(undefined2 *)(local_d0 + uVar27 * 2 + 0x20000) = 0xcccc;
        uVar7 = uVar7 + 1;
      } while (uVar20 != uVar7);
    }
    else {
      __s_00 = (int *)(local_d0 + 0x20000);
      memset((void *)local_d0,0xcc,0x20000);
      memset(__s_00,0,0x10000);
    }
    memset((HasherCommon *)(uVar2 + 0x30000),0,0x10000);
    memset((anon_union_1048_13_a959428b_for_privat *)local_4d8,0,0x400);
  }
switchD_00105401_caseD_24:
  puStack_500 = (uint32_t *)0x0;
  pBStack_4f8 = (BrotliEncoderParams *)0x0;
  local_4dc = 1;
LAB_0010584a:
  if (local_4f0.type == 0x41) {
    ppHVar6 = (HasherCommon **)
              ((long)&(((anon_union_1048_13_a959428b_for_privat *)local_4d8)->_H35).hb_common + 0x20
              );
    if (0x1f < uVar20) {
      lVar31 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 * local_480[3] + (uint)input_buffer[lVar31] + 1;
        lVar31 = lVar31 + 1;
      } while (lVar31 != 0x20);
      local_490 = CONCAT44((int)((ulong)local_490 >> 0x20),iVar3);
    }
LAB_0010593b:
    *ppHVar6 = (HasherCommon *)0x0;
  }
  else {
    ppHVar6 = &(((anon_union_1048_13_a959428b_for_privat *)local_4d8)->_H5).common_;
    if (local_4f0.type == 0x37) {
      if (0x1f < uVar20) {
        local_4d8._16_4_ = 0;
        uVar20 = 0xfffffffffffffffc;
        do {
          local_4d8._16_4_ = local_4d8._16_4_ * uStack_4ac + (uint)input_buffer[uVar20 + 4] + 1;
          uVar20 = uVar20 + 4;
        } while (uVar20 < 0x1c);
LAB_001058ea:
      }
      goto LAB_0010593b;
    }
    if (local_4f0.type == 0x23) {
      if (0x1f < uVar20) {
        local_4d8._16_4_ = 0;
        uVar20 = 0xfffffffffffffffc;
        do {
          local_4d8._16_4_ = local_4d8._16_4_ * uStack_4ac + (uint)input_buffer[uVar20 + 4] + 1;
          uVar20 = uVar20 + 4;
        } while (uVar20 < 0x1c);
        goto LAB_001058ea;
      }
      goto LAB_0010593b;
    }
  }
  uVar7 = uVar21 >> 3;
  local_728 = encoded_buffer;
  local_7b8 = 0;
  uVar20 = 0;
  prev_byte = '\0';
  prev_byte2 = '\0';
  local_7c8 = uVar4;
  do {
    uVar4 = uVar21 + uVar20;
    if (input_size < uVar4) {
      uVar4 = input_size;
    }
    last_insert_len = 0;
    num_literals = 0;
    local_760 = uVar20;
    if ((params.quality < 10) ||
       (iVar3 = BrotliIsMostlyUTF8(input_buffer,uVar20,0x7fffffffffffffff,uVar4 - uVar20,0.75),
       iVar3 != 0)) {
      literal_context_mode = CONTEXT_UTF8;
    }
    else {
      literal_context_mode = CONTEXT_SIGNED;
    }
    uVar27 = (uVar4 - uVar20) / 0xc + 0x10;
    local_708 = 0;
    local_758 = 0;
    local_7b0 = 0;
    local_7d0 = (Command_conflict *)0x0;
    uVar20 = local_760;
    while( true ) {
      num_bytes = uVar4 - uVar20;
      uVar26 = local_7b0;
      if (uVar4 < uVar20 || num_bytes == 0) break;
      if (uVar5 <= num_bytes) {
        num_bytes = uVar5;
      }
      sVar22 = num_bytes + 1;
      if (sVar22 == 0) {
        array = (ZopfliNode *)0x0;
      }
      else {
        array = (ZopfliNode *)BrotliAllocate(&memory_manager,sVar22 * 0x10);
      }
      BrotliInitZopfliNodes(array,sVar22);
      if ((0x7f < uVar20) && (2 < num_bytes)) {
        uVar26 = uVar20 - 0x7f;
        uVar8 = (num_bytes + uVar20) - 0x7f;
        if (uVar20 < uVar8) {
          uVar8 = uVar20;
        }
        if (uVar26 < uVar8) {
          local_750 = (HasherCommon *)local_4d8._0_8_;
LAB_00105b3a:
          uVar28 = uVar20 - uVar26;
          if (uVar28 < 0x10) {
            uVar28 = 0xf;
          }
          uVar13 = (uint)(*(int *)(input_buffer + (uVar26 & 0x7fffffffffffffff)) * 0x1e35a7bd) >>
                   0xf;
          uVar29 = (ulong)*(uint *)(local_4d8._8_8_ + (ulong)uVar13 * 4);
          uVar34 = (uVar26 & local_4d8._0_8_) * 2 + 1;
          uVar24 = (uVar26 & local_4d8._0_8_) * 2;
          *(uint32_t *)(local_4d8._8_8_ + (ulong)uVar13 * 4) = (uint32_t)uVar26;
          lVar31 = 0x40;
          local_778 = 0;
          local_780 = 0;
LAB_00105bcb:
          if ((uVar26 != uVar29) && (lVar31 != 0 && uVar26 - uVar29 <= local_4d8._0_8_ - uVar28)) {
            uVar14 = local_780;
            if (local_778 < local_780) {
              uVar14 = local_778;
            }
            puVar10 = input_buffer + uVar14 + uVar29;
            uVar18 = 0x80 - uVar14;
            if (7 < uVar18) {
              uVar32 = uVar18 & 0xfffffffffffffff8;
              lVar30 = 0;
              uVar19 = 0;
LAB_00105c65:
              if (*(ulong *)(puVar10 + uVar19 * 8) ==
                  *(ulong *)(input_buffer + uVar19 * 8 + uVar14 + (uVar26 & 0x7fffffffffffffff)))
              goto code_r0x00105c72;
              uVar19 = *(ulong *)(input_buffer + uVar19 * 8 + uVar14 + (uVar26 & 0x7fffffffffffffff)
                                 ) ^ *(ulong *)(puVar10 + uVar19 * 8);
              uVar18 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar19 = (uVar18 >> 3 & 0x1fffffff) - lVar30;
              goto LAB_00105cd8;
            }
            uVar32 = 0;
            goto LAB_00105d5e;
          }
          *(undefined4 *)((long)(void **)local_4d8._24_8_ + uVar24 * 4) = local_4d8._16_4_;
          *(undefined4 *)((long)(void **)local_4d8._24_8_ + uVar34 * 4) = local_4d8._16_4_;
          bVar35 = false;
          goto LAB_00105d4e;
        }
      }
LAB_00105db3:
      sVar22 = BrotliZopfliComputeShortestPath
                         (&memory_manager,num_bytes,uVar20,input_buffer,0x7fffffffffffffff,
                          "" + (literal_context_mode << 9),&params,dist_cache,
                          (Hasher *)&available_in,array);
      uVar26 = sVar22 + local_7b0 + 1;
      if (uVar26 < uVar27) {
        uVar26 = uVar27;
      }
      pCVar9 = local_7d0;
      uVar8 = local_758;
      if ((local_758 != uVar26) &&
         (pCVar9 = (Command_conflict *)BrotliAllocate(&memory_manager,uVar26 << 4), p = local_7d0,
         uVar8 = uVar26, local_7d0 != (Command_conflict *)0x0)) {
        memcpy(pCVar9,local_7d0,local_7b0 << 4);
        BrotliFree(&memory_manager,p);
      }
      local_758 = uVar8;
      uVar26 = sVar22 + local_7b0;
      local_7d0 = pCVar9;
      BrotliZopfliCreateCommands
                (num_bytes,uVar20,array,dist_cache,&last_insert_len,&params,pCVar9 + local_7b0,
                 &num_literals);
      local_708 = local_708 + num_bytes;
      BrotliFree(&memory_manager,array);
      if ((uVar7 < uVar26) ||
         (uVar20 = uVar20 + num_bytes, local_7b0 = uVar26, uVar7 < num_literals)) break;
    }
    uVar4 = local_760;
    if (last_insert_len != 0) {
      local_7d0[uVar26].insert_len_ = (uint32_t)last_insert_len;
      local_7d0[uVar26].copy_len_ = 0x8000000;
      local_7d0[uVar26].dist_extra_ = 0;
      local_7d0[uVar26].dist_prefix_ = 0x10;
      if (last_insert_len < 6) {
        uVar20 = last_insert_len & 0xffffffff;
      }
      else if (last_insert_len < 0x82) {
        uVar13 = 0x1f;
        uVar15 = (uint)(last_insert_len - 2);
        if (uVar15 != 0) {
          for (; uVar15 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar20 = (ulong)((int)(last_insert_len - 2 >> ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f))
                         + (uVar13 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (last_insert_len < 0x842) {
        uVar15 = (uint32_t)last_insert_len - 0x42;
        uVar13 = 0x1f;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar20 = (ulong)((uVar13 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar20 = 0x15;
        if (0x1841 < last_insert_len) {
          uVar20 = (ulong)(ushort)(0x17 - (last_insert_len < 0x5842));
        }
      }
      iVar3 = (int)((uVar20 & 0xffff) >> 3) * 3;
      local_7d0[uVar26].cmd_prefix_ =
           ((ushort)(0x520d40 >> ((char)iVar3 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar3 * 0x40 +
           ((ushort)uVar20 & 7) * 8 + 0x42;
      num_literals = num_literals + last_insert_len;
      uVar26 = uVar26 + 1;
    }
    uVar20 = local_708 + local_760;
    bVar35 = uVar20 == input_size;
    local_7d8 = uVar33;
    if (local_708 == 0) {
      puVar10 = (uint8_t *)BrotliAllocate(&memory_manager,0x10);
      *(short *)puVar10 = (short)local_7c8;
      *(ulong *)(puVar10 + (local_7d8 >> 3)) =
           3L << ((byte)local_7d8 & 7) | (ulong)puVar10[local_7d8 >> 3];
      local_7d8 = (ulong)((int)local_7d8 + 9U & 0xfffffff8);
    }
    else {
      iVar3 = ShouldCompress(input_buffer,0x7fffffffffffffff,local_760,local_708,num_literals,uVar26
                            );
      if (iVar3 == 0) {
        dist_cache[0] = saved_dist_cache[0];
        dist_cache[1] = saved_dist_cache[1];
        dist_cache[2] = saved_dist_cache[2];
        dist_cache[3] = saved_dist_cache[3];
        puVar10 = (uint8_t *)BrotliAllocate(&memory_manager,local_708 + 0x10);
        *(short *)puVar10 = (short)local_7c8;
        BrotliStoreUncompressedMetaBlock
                  ((uint)bVar35,input_buffer,uVar4,0x7fffffffffffffff,local_708,&local_7d8,puVar10);
      }
      else {
        memcpy(&next_out,&params,0x90);
        BrotliInitBlockSplit((BlockSplit *)&next_in);
        BrotliInitBlockSplit(&local_5b8);
        BrotliInitBlockSplit(&local_588);
        pCVar9 = local_7d0;
        local_518 = (HistogramDistance *)0x0;
        sStack_510 = 0;
        local_528 = (HistogramCommand *)0x0;
        sStack_520 = 0;
        local_538 = (HistogramLiteral *)0x0;
        sStack_530 = 0;
        local_548 = (uint32_t *)0x0;
        sStack_540 = 0;
        local_558 = (uint32_t *)0x0;
        sStack_550 = 0;
        BrotliBuildMetaBlock
                  (&memory_manager,input_buffer,uVar4,0x7fffffffffffffff,
                   (BrotliEncoderParams *)&next_out,prev_byte,prev_byte2,local_7d0,uVar26,
                   literal_context_mode,literals_block_splits_decoder,&current_block_literals,
                   cmds_block_splits_decoder,&current_block_cmds,(MetaBlockSplit *)&next_in);
        BrotliOptimizeHistograms(local_74,(MetaBlockSplit *)&next_in);
        puVar10 = (uint8_t *)BrotliAllocate(&memory_manager,local_708 * 2 + 0x1f7);
        *(short *)puVar10 = (short)local_7c8;
        BrotliStoreMetaBlock
                  (&memory_manager,input_buffer,uVar4,local_708,0x7fffffffffffffff,prev_byte,
                   prev_byte2,(uint)bVar35,(BrotliEncoderParams *)&next_out,literal_context_mode,
                   pCVar9,uVar26,(MetaBlockSplit *)&next_in,&local_7d8,puVar10);
        if (local_708 + 4 < local_7d8 >> 3) {
          dist_cache[0] = saved_dist_cache[0];
          dist_cache[1] = saved_dist_cache[1];
          dist_cache[2] = saved_dist_cache[2];
          dist_cache[3] = saved_dist_cache[3];
          *puVar10 = (uint8_t)local_7c8;
          puVar10[1] = (uint8_t)(local_7c8 >> 8);
          local_7d8 = uVar33;
          BrotliStoreUncompressedMetaBlock
                    ((uint)bVar35,input_buffer,uVar4,0x7fffffffffffffff,local_708,&local_7d8,puVar10
                    );
        }
        BrotliDestroyBlockSplit(&memory_manager,(BlockSplit *)&next_in);
        BrotliDestroyBlockSplit(&memory_manager,&local_5b8);
        BrotliDestroyBlockSplit(&memory_manager,&local_588);
        BrotliFree(&memory_manager,local_558);
        local_558 = (uint32_t *)0x0;
        BrotliFree(&memory_manager,local_548);
        local_548 = (uint32_t *)0x0;
        BrotliFree(&memory_manager,local_538);
        local_538 = (HistogramLiteral *)0x0;
        BrotliFree(&memory_manager,local_528);
        local_528 = (HistogramCommand *)0x0;
        BrotliFree(&memory_manager,local_518);
      }
    }
    uVar4 = local_7d8;
    uVar33 = local_7d8 >> 3;
    local_7c8 = (ulong)puVar10[uVar33];
    if (uVar20 < input_size) {
      prev_byte2 = input_buffer[uVar20 - 2];
      prev_byte = input_buffer[uVar20 - 1];
    }
    saved_dist_cache[0] = dist_cache[0];
    saved_dist_cache[1] = dist_cache[1];
    saved_dist_cache[2] = dist_cache[2];
    saved_dist_cache[3] = dist_cache[3];
    local_7b8 = local_7b8 + uVar33;
    if (local_7b8 <= local_7c0) {
      memcpy(local_728,puVar10,uVar33);
      local_728 = local_728 + uVar33;
    }
    BrotliFree(&memory_manager,puVar10);
    BrotliFree(&memory_manager,local_7d0);
  } while ((uVar20 < input_size) && (uVar33 = (ulong)((uint)uVar4 & 7), local_7b8 <= local_7c0));
  *encoded_size = local_7b8;
  if (available_in != 0) {
    BrotliFree(&memory_manager,(void *)available_in);
    available_in = 0;
  }
  if ((local_7c0 < local_7b8) || ((iVar3 = 1, uVar16 != 0 && (uVar16 < *encoded_size)))) {
LAB_001064c3:
    *encoded_size = 0;
    iVar3 = 0;
    if (uVar16 - 1 < local_7c0) {
      encoded_buffer[0] = '!';
      encoded_buffer[1] = '\x03';
      lVar31 = 2;
      lVar30 = 0;
      do {
        sVar17 = 0x1000000;
        if (input_size < 0x1000000) {
          sVar17 = input_size;
        }
        iVar3 = 2 - (uint)(input_size < 0x100001);
        if (input_size < 0x10001) {
          iVar3 = 0;
        }
        uVar15 = ((int)sVar17 * 8 + iVar3 * 2) - 8;
        uVar13 = 0x80000 << ((byte)(iVar3 << 2) & 0x1f) | uVar15;
        encoded_buffer[lVar31] = (uint8_t)uVar15;
        encoded_buffer[lVar31 + 1] = (uint8_t)((uint)((int)sVar17 * 8 + -8) >> 8);
        encoded_buffer[lVar31 + 2] = (uint8_t)(uVar13 >> 0x10);
        if (input_size < 0x100001) {
          lVar31 = lVar31 + 3;
        }
        else {
          encoded_buffer[lVar31 + 3] = (uint8_t)(uVar13 >> 0x18);
          lVar31 = lVar31 + 4;
        }
        memcpy(encoded_buffer + lVar31,input_buffer + lVar30,sVar17);
        lVar31 = lVar31 + sVar17;
        lVar30 = lVar30 + sVar17;
        input_size = input_size - sVar17;
      } while (input_size != 0);
      encoded_buffer[lVar31] = '\x03';
      *encoded_size = lVar31 + 1;
LAB_001065b9:
      iVar3 = 1;
    }
  }
  return iVar3;
code_r0x00105c72:
  uVar19 = uVar19 + 1;
  lVar30 = lVar30 + -8;
  if (uVar18 >> 3 == uVar19) goto code_r0x00105c7e;
  goto LAB_00105c65;
code_r0x00105c7e:
  puVar10 = puVar10 + -lVar30;
LAB_00105d5e:
  uVar18 = uVar18 & 7;
  uVar19 = uVar32;
  if (uVar18 != 0) {
    uVar25 = uVar32 | uVar18;
    do {
      uVar19 = uVar32;
      if (input_buffer[uVar32 + uVar14 + (uVar26 & 0x7fffffffffffffff)] != *puVar10) break;
      puVar10 = puVar10 + 1;
      uVar32 = uVar32 + 1;
      uVar18 = uVar18 - 1;
      uVar19 = uVar25;
    } while (uVar18 != 0);
  }
LAB_00105cd8:
  uVar19 = uVar19 + uVar14;
  if (uVar19 < 0x80) {
    uVar14 = (uVar29 & local_4d8._0_8_) * 2;
    if (input_buffer[uVar19 + uVar29] < input_buffer[uVar19 + (uVar26 & 0x7fffffffffffffff)]) {
      *(int *)((long)(void **)local_4d8._24_8_ + uVar24 * 4) = (int)uVar29;
      uVar14 = uVar14 | 1;
      uVar24 = uVar14;
      local_778 = uVar19;
    }
    else {
      *(int *)((long)(void **)local_4d8._24_8_ + uVar34 * 4) = (int)uVar29;
      uVar34 = uVar14;
      local_780 = uVar19;
    }
    uVar29 = (ulong)*(uint *)((long)(void **)local_4d8._24_8_ + uVar14 * 4);
    bVar35 = true;
  }
  else {
    *(undefined4 *)((long)(void **)local_4d8._24_8_ + uVar24 * 4) =
         *(undefined4 *)((void **)local_4d8._24_8_ + (uVar29 & local_4d8._0_8_));
    *(undefined4 *)((long)(void **)local_4d8._24_8_ + uVar34 * 4) =
         *(undefined4 *)((long)(void **)local_4d8._24_8_ + (uVar29 & local_4d8._0_8_) * 8 + 4);
    bVar35 = false;
  }
LAB_00105d4e:
  lVar31 = lVar31 + -1;
  if (!bVar35) goto LAB_00105d9a;
  goto LAB_00105bcb;
LAB_00105d9a:
  uVar26 = uVar26 + 1;
  if (uVar26 == uVar8) goto LAB_00105db3;
  goto LAB_00105b3a;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t* input_buffer, size_t* encoded_size,
    uint8_t* encoded_buffer,
    const BackwardReferenceFromDecoder* backward_references,
    const size_t back_refs_size,
    const BlockSplitFromDecoder* literals_block_splits_decoder,
    const BlockSplitFromDecoder* cmds_block_splits_decoder) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }
  if (quality == 10) {
    /* TODO: Implement this direct path for all quality levels. */
    const int lg_win = BROTLI_MIN(int, BROTLI_LARGE_MAX_WINDOW_BITS,
                                       BROTLI_MAX(int, 16, lgwin));
    int ok = BrotliCompressBufferQuality10(lg_win, input_size, input_buffer,
                                           encoded_size, encoded_buffer,
                                           backward_references, back_refs_size,
                                           literals_block_splits_decoder,
                                           cmds_block_splits_decoder);
    if (!ok || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  s->backward_references_ = backward_references;
  s->back_refs_size_ = back_refs_size;
  s->literals_block_splits_decoder_ = literals_block_splits_decoder;
  s->cmds_block_splits_decoder_ = cmds_block_splits_decoder;
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    if (lgwin > BROTLI_MAX_WINDOW_BITS) {
      BrotliEncoderSetParameter(s, BROTLI_PARAM_LARGE_WINDOW, BROTLI_TRUE);
    }
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}